

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O1

size_t x25519_get1_tls_encodedpoint(EVP_PKEY *pkey,uint8_t **out_ptr)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  if (pkey->pkey == (void *)0x0) {
    sVar2 = 0;
    ERR_put_error(6,0,0x78,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                  ,0x7a);
  }
  else {
    puVar1 = (uint8_t *)OPENSSL_memdup(pkey->pkey,0x20);
    *out_ptr = puVar1;
    sVar2 = (ulong)(puVar1 != (uint8_t *)0x0) << 5;
  }
  return sVar2;
}

Assistant:

static size_t x25519_get1_tls_encodedpoint(const EVP_PKEY *pkey,
                                           uint8_t **out_ptr) {
  const X25519_KEY *key = reinterpret_cast<X25519_KEY *>(pkey->pkey);
  if (key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_KEY_SET);
    return 0;
  }

  *out_ptr = reinterpret_cast<uint8_t *>(OPENSSL_memdup(key->pub, 32));
  return *out_ptr == NULL ? 0 : 32;
}